

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O3

void __thiscall Snake::move(Snake *this)

{
  pointer *pppOVar1;
  iterator __position;
  bool bVar2;
  Point in_RAX;
  Body *this_00;
  __normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_> __tmp;
  pointer ppOVar3;
  Point local_18;
  
  local_18 = in_RAX;
  bVar2 = Head::want_tail(this->head);
  if (bVar2) {
    this->points = this->points + 1;
    this_00 = (Body *)operator_new(0x28);
    local_18.x = 0;
    local_18.y = 0;
    Body::Body(this_00,&local_18,this->tail);
    this->tail = (PObject)this_00;
    __position._M_current =
         (this->body).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->body).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Object*,std::allocator<Object*>>::_M_realloc_insert<Object*const&>
                ((vector<Object*,std::allocator<Object*>> *)&this->body,__position,&this->tail);
    }
    else {
      *__position._M_current = (Object *)this_00;
      pppOVar1 = &(this->body).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
    Head::give_tail(this->head,false);
  }
  for (ppOVar3 = (this->body).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppOVar3 !=
      (this->body).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_start; ppOVar3 = ppOVar3 + -1) {
    (**ppOVar3[-1]->_vptr_Object)();
  }
  return;
}

Assistant:

void Snake::move(){
	if (head->want_tail()){
		points++;
		PObject temp = new Body(Point(), tail);
		tail = temp;
		body.push_back(tail);
		head->give_tail(false);
	}
	for (vector<PObject>::reverse_iterator i = body.rbegin(); i != body.rend(); i++){
		(*i)->move();
	}
}